

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

void __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::ModuleImpl
          (ModuleImpl *this,Impl *loader,Own<const_kj::ReadableFile> *file,
          ReadableDirectory *sourceDir,Path *pathParam)

{
  ReadableFile *pRVar1;
  Fault f;
  Fault FStack_28;
  
  (this->super_Module).super_ErrorReporter._vptr_ErrorReporter =
       (_func_int **)&PTR_addError_00307200;
  this->loader = loader;
  pRVar1 = file->ptr;
  (this->file).disposer = file->disposer;
  (this->file).ptr = pRVar1;
  file->ptr = (ReadableFile *)0x0;
  this->sourceDir = sourceDir;
  (this->path).parts.ptr = (pathParam->parts).ptr;
  (this->path).parts.size_ = (pathParam->parts).size_;
  (this->path).parts.disposer = (pathParam->parts).disposer;
  (pathParam->parts).ptr = (String *)0x0;
  (pathParam->parts).size_ = 0;
  kj::Path::toString(&this->sourceNameStr,&this->path,false);
  (this->lineBreaks).ptr.disposer = (Disposer *)0x0;
  (this->lineBreaks).ptr.ptr = (LineBreakTable *)0x0;
  if ((this->path).parts.size_ != 0) {
    return;
  }
  kj::_::Debug::Fault::Fault
            (&FStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/module-loader.c++"
             ,0x98,FAILED,"path.size() > 0","");
  kj::_::Debug::Fault::fatal(&FStack_28);
}

Assistant:

ModuleImpl(ModuleLoader::Impl& loader, kj::Own<const kj::ReadableFile> file,
             const kj::ReadableDirectory& sourceDir, kj::Path pathParam)
      : loader(loader), file(kj::mv(file)), sourceDir(sourceDir), path(kj::mv(pathParam)),
        sourceNameStr(path.toString()) {
    KJ_REQUIRE(path.size() > 0);
  }